

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

vector<Function_*,_std::allocator<Function_*>_> * __thiscall
Semantic::SymbolTable::getFreeFunction(SymbolTable *this,string *funcName)

{
  bool bVar1;
  UndeclaredFunction *this_00;
  mapped_type *pmVar2;
  string local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
  local_20;
  string *local_18;
  string *funcName_local;
  SymbolTable *this_local;
  
  local_18 = funcName;
  funcName_local = (string *)this;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
       ::find(&this->freeFunctions,funcName);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
       ::end(&this->freeFunctions);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (!bVar1) {
    pmVar2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
             ::at(&this->freeFunctions,local_18);
    return pmVar2;
  }
  this_00 = (UndeclaredFunction *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_48,(string *)local_18);
  Err::UndeclaredFunction::UndeclaredFunction(this_00,&local_48,0);
  __cxa_throw(this_00,&Err::UndeclaredFunction::typeinfo,
              Err::UndeclaredFunction::~UndeclaredFunction);
}

Assistant:

const std::vector<Function *> &Semantic::SymbolTable::getFreeFunction(const std::string &funcName) const {
    if (freeFunctions.find(funcName) == freeFunctions.end())
        throw Semantic::Err::UndeclaredFunction(funcName, 0);

    return freeFunctions.at(funcName);
}